

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall
QRhiGles2::compileShader
          (QRhiGles2 *this,GLuint program,QRhiShaderStage *shaderStage,QShaderVersion *shaderVersion
          )

{
  bool bVar1;
  Type type;
  uint *puVar2;
  qsizetype qVar3;
  char *pcVar4;
  char *pcVar5;
  QRhiShaderStage *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  uint shader_1;
  QHash<QRhiShaderStage,_unsigned_int> *__range3;
  iterator __end3;
  iterator __begin3;
  GLsizei length;
  QByteArray log;
  GLint infoLogLength;
  GLint compiled;
  GLint srcLength;
  char *srcStr;
  const_iterator cacheIt;
  GLuint shader;
  QByteArray source;
  GLuint in_stack_fffffffffffffeb8;
  GLuint in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  const_iterator *in_stack_fffffffffffffec8;
  QMessageLogger *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  QRhiShaderStage *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  bool local_c1;
  char local_a0 [36];
  undefined4 local_7c;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int local_5c;
  int local_58;
  undefined4 local_54;
  char *local_50;
  piter local_48;
  piter local_38;
  GLuint local_24;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  shaderSource((QRhiGles2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08,
               (QShaderVersion *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  bVar1 = QByteArray::isEmpty((QByteArray *)0x929dfa);
  if (bVar1) {
    local_c1 = false;
  }
  else {
    local_24 = 0xaaaaaaaa;
    local_38.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = (piter)QHash<QRhiShaderStage,_unsigned_int>::constFind
                                ((QHash<QRhiShaderStage,_unsigned_int> *)
                                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                 (QRhiShaderStage *)
                                 CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_48 = (piter)QHash<QRhiShaderStage,_unsigned_int>::constEnd
                                ((QHash<QRhiShaderStage,_unsigned_int> *)in_stack_fffffffffffffec8);
    bVar1 = QHash<QRhiShaderStage,_unsigned_int>::const_iterator::operator!=
                      (in_stack_fffffffffffffec8,
                       (const_iterator *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    if (bVar1) {
      puVar2 = QHash<QRhiShaderStage,_unsigned_int>::const_iterator::operator*
                         ((const_iterator *)0x929ead);
      local_24 = *puVar2;
    }
    else {
      type = QRhiShaderStage::type(in_RDX);
      toGlShaderType(type);
      local_24 = QOpenGLFunctions::glCreateShader
                           ((QOpenGLFunctions *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffebc);
      local_50 = QByteArray::constData((QByteArray *)0x929efd);
      qVar3 = QByteArray::size(&local_20);
      local_54 = (undefined4)qVar3;
      QOpenGLFunctions::glShaderSource
                ((QOpenGLFunctions *)in_stack_fffffffffffffed0,
                 (GLuint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (GLsizei)in_stack_fffffffffffffec8,
                 (char **)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (GLint *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QOpenGLFunctions::glCompileShader
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
      local_58 = 0;
      QOpenGLFunctions::glGetShaderiv
                ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,(GLint *)0x929f91);
      if (local_58 == 0) {
        local_5c = 0;
        QOpenGLFunctions::glGetShaderiv
                  ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
                   ,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,(GLint *)0x929fcf);
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray((QByteArray *)0x92a009);
        if (1 < local_5c) {
          local_7c = 0;
          QByteArray::resize((longlong)&local_78);
          in_stack_fffffffffffffed0 = *(QMessageLogger **)(in_RDI + 400);
          QByteArray::data((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          QOpenGLFunctions::glGetShaderInfoLog
                    ((QOpenGLFunctions *)in_stack_fffffffffffffed0,
                     (GLuint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                     (GLsizei)in_stack_fffffffffffffec8,
                     (GLsizei *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        }
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec4,
                   (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        pcVar4 = QByteArray::constData((QByteArray *)0x92a0a7);
        pcVar5 = QByteArray::constData((QByteArray *)0x92a0b9);
        QMessageLogger::warning
                  (local_a0,"Failed to compile shader: %s\nSource was:\n%s",pcVar4,pcVar5);
        local_c1 = false;
        QByteArray::~QByteArray((QByteArray *)0x92a0f4);
        goto LAB_0092a25f;
      }
      qVar3 = QHash<QRhiShaderStage,_unsigned_int>::size
                        ((QHash<QRhiShaderStage,_unsigned_int> *)(in_RDI + 0x868));
      if (0x7f < qVar3) {
        QHash<QRhiShaderStage,_unsigned_int>::begin
                  ((QHash<QRhiShaderStage,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QHash<QRhiShaderStage,_unsigned_int>::end
                  ((QHash<QRhiShaderStage,_unsigned_int> *)in_stack_fffffffffffffec8);
        while( true ) {
          bVar1 = QHash<QRhiShaderStage,_unsigned_int>::iterator::operator!=
                            ((iterator *)in_stack_fffffffffffffec8,
                             (iterator *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (!bVar1) break;
          QHash<QRhiShaderStage,_unsigned_int>::iterator::operator*((iterator *)0x92a1cd);
          QOpenGLFunctions::glDeleteShader
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc);
          QHash<QRhiShaderStage,_unsigned_int>::iterator::operator++
                    ((iterator *)in_stack_fffffffffffffed0);
        }
        QHash<QRhiShaderStage,_unsigned_int>::clear
                  ((QHash<QRhiShaderStage,_unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      QHash<QRhiShaderStage,_unsigned_int>::insert
                ((QHash<QRhiShaderStage,_unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (QRhiShaderStage *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 (uint *)0x92a229);
    }
    QOpenGLFunctions::glAttachShader
              ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
    local_c1 = true;
  }
LAB_0092a25f:
  QByteArray::~QByteArray((QByteArray *)0x92a26c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c1;
  }
  __stack_chk_fail();
}

Assistant:

bool QRhiGles2::compileShader(GLuint program, const QRhiShaderStage &shaderStage, QShaderVersion *shaderVersion)
{
    const QByteArray source = shaderSource(shaderStage, shaderVersion);
    if (source.isEmpty())
        return false;

    GLuint shader;
    auto cacheIt = m_shaderCache.constFind(shaderStage);
    if (cacheIt != m_shaderCache.constEnd()) {
        shader = *cacheIt;
    } else {
        shader = f->glCreateShader(toGlShaderType(shaderStage.type()));
        const char *srcStr = source.constData();
        const GLint srcLength = source.size();
        f->glShaderSource(shader, 1, &srcStr, &srcLength);
        f->glCompileShader(shader);
        GLint compiled = 0;
        f->glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
        if (!compiled) {
            GLint infoLogLength = 0;
            f->glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);
            QByteArray log;
            if (infoLogLength > 1) {
                GLsizei length = 0;
                log.resize(infoLogLength);
                f->glGetShaderInfoLog(shader, infoLogLength, &length, log.data());
            }
            qWarning("Failed to compile shader: %s\nSource was:\n%s", log.constData(), source.constData());
            return false;
        }
        if (m_shaderCache.size() >= MAX_SHADER_CACHE_ENTRIES) {
            // Use the simplest strategy: too many cached shaders -> drop them all.
            for (uint shader : m_shaderCache)
                f->glDeleteShader(shader); // does not actually get released yet when attached to a not-yet-released program
            m_shaderCache.clear();
        }
        m_shaderCache.insert(shaderStage, shader);
    }

    f->glAttachShader(program, shader);

    return true;
}